

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Events.c
# Opt level: O0

void set_character_route(tgestate_t *state,character_t character,route_t route)

{
  byte bVar1;
  characterstruct_t *pcVar2;
  route_t in_DX;
  byte in_SIL;
  tgestate_t *in_RDI;
  uint8_t iters;
  vischar_t *vischar;
  characterstruct_t *charstr;
  char local_29;
  vischar_t *local_28;
  undefined7 in_stack_ffffffffffffffe8;
  
  pcVar2 = in_RDI->character_structs + in_SIL;
  if ((pcVar2->character_and_flags & 0x40) == 0) {
    pcVar2->route = in_DX;
  }
  else {
    bVar1 = pcVar2->character_and_flags;
    local_29 = '\a';
    local_28 = in_RDI->vischars;
    do {
      local_28 = local_28 + 1;
      if ((bVar1 & 0x1f) == local_28->character) {
        local_28->flags = local_28->flags & 0xbf;
        local_28->route = in_DX;
        set_route(in_RDI,(vischar_t *)
                         (CONCAT17(bVar1,in_stack_ffffffffffffffe8) & 0x1fffffffffffffff));
        return;
      }
      local_29 = local_29 + -1;
    } while (local_29 != '\0');
  }
  return;
}

Assistant:

static void set_character_route(tgestate_t *state,
                                character_t character,
                                route_t     route)
{
  characterstruct_t *charstr; /* was HL */
  vischar_t         *vischar; /* was HL */
  uint8_t            iters;   /* was B */

  assert(state != NULL);
  ASSERT_CHARACTER_VALID(character);
  ASSERT_ROUTE_VALID(route);

  charstr = &state->character_structs[character];
  if (charstr->character_and_flags & characterstruct_FLAG_ON_SCREEN)
  {
    assert(character == (charstr->character_and_flags & characterstruct_CHARACTER_MASK));

    // Why fetch this copy of character index, is it not the same as the passed-in character?
    // might just be a re-fetch when the original code clobbers register A.
    character = charstr->character_and_flags & characterstruct_CHARACTER_MASK;

    /* Search non-player characters to see if this character is already on-screen. */
    iters = vischars_LENGTH - 1;
    vischar = &state->vischars[1];
    do
    {
      if (character == vischar->character)
        goto found_on_screen; /* Character is on-screen: store to vischar. */
      vischar++;
    }
    while (--iters);

    return; /* Conv: Was goto exit; */
  }

  /* Store to characterstruct only. */
  charstr->route = route;
  return;

  // FUTURE: Move this chunk into the body of the loop above.
found_on_screen:
  vischar->flags &= ~vischar_FLAGS_TARGET_IS_DOOR;
  vischar->route = route;

  set_route(state, vischar); // was fallthrough
}